

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool nlohmann::operator<(const_reference lhs,const_reference rhs)

{
  value_t vVar1;
  value_t vVar2;
  byte extraout_var;
  bool bVar3;
  bool bVar4;
  number_float_t nVar5;
  double dVar6;
  
  vVar1 = lhs->m_type;
  vVar2 = rhs->m_type;
  if (vVar1 == vVar2) {
    switch(vVar1) {
    case object:
      bVar3 = std::
              __lexicographical_compare_impl<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((((lhs->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                         _M_left,&(((lhs->m_value).object)->_M_t)._M_impl.super__Rb_tree_header,
                         (((rhs->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header.
                         _M_left,&(((rhs->m_value).object)->_M_t)._M_impl.super__Rb_tree_header);
      break;
    case array:
      bVar3 = std::
              __lexicographical_compare_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const*,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const*,__gnu_cxx::__ops::_Iter_less_iter>
                        ((((lhs->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (((lhs->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,
                         (((rhs->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (((rhs->m_value).array)->
                         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      break;
    case string:
      std::__cxx11::string::compare((string *)(lhs->m_value).object);
      bVar3 = (bool)(extraout_var >> 7);
      break;
    case boolean:
      bVar3 = (lhs->m_value).boolean < (rhs->m_value).boolean;
      break;
    case number_integer:
switchD_001b26b2_caseD_5:
      bVar3 = (lhs->m_value).number_integer < (rhs->m_value).number_integer;
      break;
    case number_unsigned:
      bVar3 = (lhs->m_value).object < (rhs->m_value).object;
      break;
    case number_float:
      nVar5 = (rhs->m_value).number_float;
LAB_001b27da:
      bVar3 = nVar5 == (lhs->m_value).number_float;
      bVar4 = nVar5 < (lhs->m_value).number_float;
      goto LAB_001b27df;
    default:
switchD_001b26b2_default:
      bVar3 = false;
    }
  }
  else {
    if (vVar2 == number_float && vVar1 == number_integer) {
      bVar3 = (rhs->m_value).number_float == (double)(lhs->m_value).number_integer;
      bVar4 = (rhs->m_value).number_float < (double)(lhs->m_value).number_integer;
    }
    else {
      if (vVar2 == number_integer && vVar1 == number_float) {
        nVar5 = (number_float_t)(rhs->m_value).number_integer;
        goto LAB_001b27da;
      }
      if (vVar1 == number_unsigned && vVar2 == number_float) {
        dVar6 = ((double)CONCAT44(0x45300000,(int)((ulong)(lhs->m_value).number_integer >> 0x20)) -
                1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)(lhs->m_value).number_integer) -
                4503599627370496.0);
        bVar3 = (rhs->m_value).number_float == dVar6;
        bVar4 = (rhs->m_value).number_float < dVar6;
      }
      else {
        if (vVar2 != number_unsigned || vVar1 != number_float) {
          if ((vVar1 != number_integer || vVar2 != number_unsigned) &&
             (vVar2 != number_integer || vVar1 != number_unsigned)) {
            if ((vVar1 | vVar2) < discarded) {
              return *(byte *)((long)&detail::
                                      operator<(nlohmann::detail::value_t,nlohmann::detail::value_t)
                                      ::order + (ulong)vVar1) <
                     *(byte *)((long)&detail::
                                      operator<(nlohmann::detail::value_t,nlohmann::detail::value_t)
                                      ::order + (ulong)vVar2);
            }
            goto switchD_001b26b2_default;
          }
          goto switchD_001b26b2_caseD_5;
        }
        dVar6 = ((double)CONCAT44(0x45300000,(int)((ulong)(rhs->m_value).number_integer >> 0x20)) -
                1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)(rhs->m_value).number_integer) -
                4503599627370496.0);
        bVar3 = dVar6 == (lhs->m_value).number_float;
        bVar4 = dVar6 < (lhs->m_value).number_float;
      }
    }
LAB_001b27df:
    bVar3 = !bVar4 && !bVar3;
  }
  return bVar3;
}

Assistant:

friend bool operator<(const_reference lhs, const_reference rhs) noexcept {
		const auto lhs_type = lhs.type();
		const auto rhs_type = rhs.type();

		if (lhs_type == rhs_type) {
			switch (lhs_type) {
				case value_t::array:
					return (*lhs.m_value.array) < (*rhs.m_value.array);

				case value_t::object:
					return *lhs.m_value.object < *rhs.m_value.object;

				case value_t::null:
					return false;

				case value_t::string:
					return *lhs.m_value.string < *rhs.m_value.string;

				case value_t::boolean:
					return lhs.m_value.boolean < rhs.m_value.boolean;

				case value_t::number_integer:
					return lhs.m_value.number_integer < rhs.m_value.number_integer;

				case value_t::number_unsigned:
					return lhs.m_value.number_unsigned < rhs.m_value.number_unsigned;

				case value_t::number_float:
					return lhs.m_value.number_float < rhs.m_value.number_float;

				default:
					return false;
			}
		} else if (lhs_type == value_t::number_integer and rhs_type == value_t::number_float) {
			return static_cast<number_float_t>(lhs.m_value.number_integer) < rhs.m_value.number_float;
		} else if (lhs_type == value_t::number_float and rhs_type == value_t::number_integer) {
			return lhs.m_value.number_float < static_cast<number_float_t>(rhs.m_value.number_integer);
		} else if (lhs_type == value_t::number_unsigned and rhs_type == value_t::number_float) {
			return static_cast<number_float_t>(lhs.m_value.number_unsigned) < rhs.m_value.number_float;
		} else if (lhs_type == value_t::number_float and rhs_type == value_t::number_unsigned) {
			return lhs.m_value.number_float < static_cast<number_float_t>(rhs.m_value.number_unsigned);
		} else if (lhs_type == value_t::number_integer and rhs_type == value_t::number_unsigned) {
			return lhs.m_value.number_integer < static_cast<number_integer_t>(rhs.m_value.number_unsigned);
		} else if (lhs_type == value_t::number_unsigned and rhs_type == value_t::number_integer) {
			return static_cast<number_integer_t>(lhs.m_value.number_unsigned) < rhs.m_value.number_integer;
		}

		// We only reach this line if we cannot compare values. In that case,
		// we compare types. Note we have to call the operator explicitly,
		// because MSVC has problems otherwise.
		return operator<(lhs_type, rhs_type);
	}